

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compilation.cpp
# Opt level: O3

parser<pstore::exchange::import_ns::callbacks> *
anon_unknown.dwarf_a82ba::import_compilation_parser
          (parser<pstore::exchange::import_ns::callbacks> *__return_storage_ptr__,
          transaction *transaction,string_mapping *names,
          shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
          *fragment_index,digest *digest)

{
  parser<pstore::exchange::import_ns::callbacks> *extraout_RAX;
  parser<pstore::exchange::import_ns::callbacks> *extraout_RAX_00;
  parser<pstore::exchange::import_ns::callbacks> *extraout_RAX_01;
  parser<pstore::exchange::import_ns::callbacks> *ppVar1;
  callbacks local_58;
  callbacks local_48;
  not_null<pstore::database_*> local_38;
  
  local_38.ptr_ = (transaction->super_transaction_base).db_;
  pstore::gsl::not_null<pstore::database_*>::ensure_invariant(&local_38);
  pstore::exchange::import_ns::callbacks::
  make<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::compilation,pstore::transaction<std::unique_lock<mock_mutex>>*,pstore::exchange::import_ns::string_mapping*,std::reference_wrapper<std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>const>,std::reference_wrapper<pstore::uint128_const>>,pstore::transaction<std::unique_lock<mock_mutex>>*,pstore::exchange::import_ns::string_mapping*,std::reference_wrapper<std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>const>,std::reference_wrapper<pstore::uint128_const>>
            (&local_48,local_38,transaction,names,
             (reference_wrapper<const_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>
              )fragment_index,(reference_wrapper<const_pstore::uint128>)digest);
  local_58.context_.
  super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_48.context_.
       super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_58.context_.
  super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_48.context_.
          super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if (local_48.context_.
      super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48.context_.
       super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_48.context_.
            super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_48.context_.
       super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_48.context_.
            super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::parser
            (__return_storage_ptr__,&local_58,none);
  ppVar1 = extraout_RAX;
  if (local_58.context_.
      super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.context_.
               super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    ppVar1 = extraout_RAX_00;
  }
  if (local_48.context_.
      super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.context_.
               super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    ppVar1 = extraout_RAX_01;
  }
  return ppVar1;
}

Assistant:

decltype (auto) import_compilation_parser (
        transaction * const transaction, pstore::exchange::import_ns::string_mapping * const names,
        std::shared_ptr<pstore::index::fragment_index> const & fragment_index,
        pstore::index::digest const & digest) {
        return make_json_object_parser<pstore::exchange::import_ns::compilation> (
            &transaction->db (), transaction, names, std::cref (fragment_index),
            std::cref (digest));
    }